

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O0

void __thiscall cpprofiler::Connector::sendOverSocket(Connector *this)

{
  vector<char,_std::allocator<char>_> *in_RDI;
  vector<char,_std::allocator<char>_> buf;
  MessageMarshalling *in_stack_000000f8;
  Connector *in_stack_ffffffffffffffd0;
  
  if ((in_RDI[7].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 & 1) != 0) {
    MessageMarshalling::serialize(in_stack_000000f8);
    sendRawMsg(in_stack_ffffffffffffffd0,in_RDI);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void sendOverSocket() {
    if (!_connected) return;

    std::vector<char> buf = marshalling.serialize();

    sendRawMsg(buf);
  }